

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O1

void add_noise_to_block_hbd
               (aom_film_grain_t *params,uint16_t *luma,uint16_t *cb,uint16_t *cr,int luma_stride,
               int chroma_stride,int *luma_grain,int *cb_grain,int *cr_grain,int luma_grain_stride,
               int chroma_grain_stride,int half_luma_height,int half_luma_width,int bit_depth,
               int chroma_subsamp_y,int chroma_subsamp_x,int mc_identity)

{
  ushort uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  int local_d8;
  int local_d4;
  int local_d0;
  uint16_t *local_c8;
  uint16_t *local_c0;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  ulong local_90;
  int *local_78;
  int *local_70;
  
  bVar11 = (byte)bit_depth - 8;
  local_d8 = 1 << ((byte)bit_depth & 0x1f);
  bVar3 = (byte)params->scaling_shift;
  iVar15 = 1 << (bVar3 - 1 & 0x1f);
  bVar22 = true;
  bVar21 = true;
  if (params->num_cb_points < 1) {
    bVar21 = params->chroma_scaling_from_luma != 0;
  }
  if (params->num_cr_points < 1) {
    bVar22 = params->chroma_scaling_from_luma != 0;
  }
  if (params->chroma_scaling_from_luma == 0) {
    local_b0 = params->cb_mult + -0x80;
    local_ac = params->cb_luma_mult + -0x80;
    local_d4 = (params->cb_offset << (bVar11 & 0x1f)) - local_d8;
    local_a8 = params->cr_mult + -0x80;
    local_a4 = params->cr_luma_mult + -0x80;
    local_d8 = (params->cr_offset << (bVar11 & 0x1f)) - local_d8;
  }
  else {
    local_d8 = 0;
    local_a4 = 0x40;
    local_a8 = 0;
    local_d4 = 0;
    local_ac = 0x40;
    local_b0 = 0;
  }
  if (params->clip_to_restricted_range == 0) {
    local_d0 = (0x100 << (bVar11 & 0x1f)) + -1;
    iVar17 = 0;
    iVar7 = local_d0;
  }
  else {
    iVar17 = 0x10 << (bVar11 & 0x1f);
    local_d0 = 0xeb << (bVar11 & 0x1f);
    iVar7 = 0xf0 << (bVar11 & 0x1f);
    if (mc_identity != 0) {
      iVar7 = local_d0;
    }
  }
  iVar8 = params->num_y_points;
  bVar2 = 1 - (byte)chroma_subsamp_y & 0x1f;
  uVar12 = (uint16_t)iVar17;
  if (0 < half_luma_height << bVar2) {
    local_70 = cr_grain;
    uVar16 = half_luma_width << (1U - (char)chroma_subsamp_x & 0x1f);
    local_78 = cb_grain;
    iVar18 = (0x100 << (bVar11 & 0x1f)) + -1;
    local_90 = 0;
    local_c8 = cb;
    local_c0 = cr;
    do {
      if (0 < (int)uVar16) {
        iVar4 = ((int)local_90 << ((byte)chroma_subsamp_y & 0x1f)) * luma_stride;
        lVar19 = 0;
        do {
          if (chroma_subsamp_x == 0) {
            uVar14 = (uint)*(ushort *)((long)luma + lVar19 + (long)iVar4 * 2);
          }
          else {
            lVar9 = (long)(iVar4 + (int)lVar19);
            uVar14 = (uint)luma[lVar9 + 1] + (uint)luma[lVar9] + 1 >> 1 & 0xffff;
          }
          if (bVar21) {
            uVar1 = *(ushort *)((long)local_c8 + lVar19);
            iVar5 = ((int)(local_b0 * (uint)uVar1 + uVar14 * local_ac) >> 6) + local_d4;
            iVar6 = iVar5;
            if (iVar18 <= iVar5) {
              iVar6 = iVar18;
            }
            if (iVar5 < 0) {
              iVar6 = 0;
            }
            iVar6 = scale_LUT(scaling_lut_cb,iVar6,bit_depth);
            iVar5 = (iVar6 * *(int *)((long)local_78 + lVar19 * 2) + iVar15 >> (bVar3 & 0x1f)) +
                    (uint)uVar1;
            iVar6 = iVar5;
            if (iVar7 <= iVar5) {
              iVar6 = iVar7;
            }
            uVar13 = uVar12;
            if (iVar17 <= iVar5) {
              uVar13 = (uint16_t)iVar6;
            }
            *(uint16_t *)((long)local_c8 + lVar19) = uVar13;
          }
          if (bVar22) {
            uVar1 = *(ushort *)((long)local_c0 + lVar19);
            iVar5 = ((int)(local_a8 * (uint)uVar1 + uVar14 * local_a4) >> 6) + local_d8;
            iVar6 = iVar5;
            if (iVar18 <= iVar5) {
              iVar6 = iVar18;
            }
            if (iVar5 < 0) {
              iVar6 = 0;
            }
            iVar6 = scale_LUT(scaling_lut_cr,iVar6,bit_depth);
            iVar5 = (iVar6 * *(int *)((long)local_70 + lVar19 * 2) + iVar15 >> (bVar3 & 0x1f)) +
                    (uint)uVar1;
            iVar6 = iVar5;
            if (iVar7 <= iVar5) {
              iVar6 = iVar7;
            }
            uVar13 = uVar12;
            if (iVar17 <= iVar5) {
              uVar13 = (uint16_t)iVar6;
            }
            *(uint16_t *)((long)local_c0 + lVar19) = uVar13;
          }
          lVar19 = lVar19 + 2;
        } while ((ulong)uVar16 * 2 != lVar19);
      }
      local_90 = local_90 + 1;
      local_70 = local_70 + chroma_grain_stride;
      local_c0 = local_c0 + chroma_stride;
      local_78 = local_78 + chroma_grain_stride;
      local_c8 = local_c8 + chroma_stride;
    } while (local_90 != (uint)(half_luma_height << bVar2));
  }
  if ((0 < iVar8) && (0 < half_luma_height * 2)) {
    uVar10 = 0;
    do {
      if (0 < half_luma_width * 2) {
        uVar20 = 0;
        do {
          uVar1 = luma[uVar20];
          iVar7 = scale_LUT(scaling_lut_y,(uint)uVar1,bit_depth);
          iVar8 = (iVar7 * luma_grain[uVar20] + iVar15 >> (bVar3 & 0x1f)) + (uint)uVar1;
          iVar7 = iVar8;
          if (local_d0 <= iVar8) {
            iVar7 = local_d0;
          }
          uVar13 = uVar12;
          if (iVar17 <= iVar8) {
            uVar13 = (uint16_t)iVar7;
          }
          luma[uVar20] = uVar13;
          uVar20 = uVar20 + 1;
        } while ((uint)(half_luma_width * 2) != uVar20);
      }
      uVar10 = uVar10 + 1;
      luma_grain = luma_grain + luma_grain_stride;
      luma = luma + luma_stride;
    } while (uVar10 != (uint)(half_luma_height * 2));
  }
  return;
}

Assistant:

static void add_noise_to_block_hbd(
    const aom_film_grain_t *params, uint16_t *luma, uint16_t *cb, uint16_t *cr,
    int luma_stride, int chroma_stride, int *luma_grain, int *cb_grain,
    int *cr_grain, int luma_grain_stride, int chroma_grain_stride,
    int half_luma_height, int half_luma_width, int bit_depth,
    int chroma_subsamp_y, int chroma_subsamp_x, int mc_identity) {
  int cb_mult = params->cb_mult - 128;            // fixed scale
  int cb_luma_mult = params->cb_luma_mult - 128;  // fixed scale
  // offset value depends on the bit depth
  int cb_offset = (params->cb_offset << (bit_depth - 8)) - (1 << bit_depth);

  int cr_mult = params->cr_mult - 128;            // fixed scale
  int cr_luma_mult = params->cr_luma_mult - 128;  // fixed scale
  // offset value depends on the bit depth
  int cr_offset = (params->cr_offset << (bit_depth - 8)) - (1 << bit_depth);

  int rounding_offset = (1 << (params->scaling_shift - 1));

  int apply_y = params->num_y_points > 0 ? 1 : 0;
  int apply_cb =
      (params->num_cb_points > 0 || params->chroma_scaling_from_luma) > 0 ? 1
                                                                          : 0;
  int apply_cr =
      (params->num_cr_points > 0 || params->chroma_scaling_from_luma) > 0 ? 1
                                                                          : 0;

  if (params->chroma_scaling_from_luma) {
    cb_mult = 0;        // fixed scale
    cb_luma_mult = 64;  // fixed scale
    cb_offset = 0;

    cr_mult = 0;        // fixed scale
    cr_luma_mult = 64;  // fixed scale
    cr_offset = 0;
  }

  int min_luma, max_luma, min_chroma, max_chroma;

  if (params->clip_to_restricted_range) {
    min_luma = min_luma_legal_range << (bit_depth - 8);
    max_luma = max_luma_legal_range << (bit_depth - 8);

    if (mc_identity) {
      min_chroma = min_luma_legal_range << (bit_depth - 8);
      max_chroma = max_luma_legal_range << (bit_depth - 8);
    } else {
      min_chroma = min_chroma_legal_range << (bit_depth - 8);
      max_chroma = max_chroma_legal_range << (bit_depth - 8);
    }
  } else {
    min_luma = min_chroma = 0;
    max_luma = max_chroma = (256 << (bit_depth - 8)) - 1;
  }

  for (int i = 0; i < (half_luma_height << (1 - chroma_subsamp_y)); i++) {
    for (int j = 0; j < (half_luma_width << (1 - chroma_subsamp_x)); j++) {
      int average_luma = 0;
      if (chroma_subsamp_x) {
        average_luma = (luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x)] +
                        luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x) + 1] +
                        1) >>
                       1;
      } else {
        average_luma = luma[(i << chroma_subsamp_y) * luma_stride + j];
      }

      if (apply_cb) {
        cb[i * chroma_stride + j] = clamp(
            cb[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cb,
                            clamp(((average_luma * cb_luma_mult +
                                    cb_mult * cb[i * chroma_stride + j]) >>
                                   6) +
                                      cb_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            bit_depth) *
                      cb_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
      if (apply_cr) {
        cr[i * chroma_stride + j] = clamp(
            cr[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cr,
                            clamp(((average_luma * cr_luma_mult +
                                    cr_mult * cr[i * chroma_stride + j]) >>
                                   6) +
                                      cr_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            bit_depth) *
                      cr_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
    }
  }

  if (apply_y) {
    for (int i = 0; i < (half_luma_height << 1); i++) {
      for (int j = 0; j < (half_luma_width << 1); j++) {
        luma[i * luma_stride + j] =
            clamp(luma[i * luma_stride + j] +
                      ((scale_LUT(scaling_lut_y, luma[i * luma_stride + j],
                                  bit_depth) *
                            luma_grain[i * luma_grain_stride + j] +
                        rounding_offset) >>
                       params->scaling_shift),
                  min_luma, max_luma);
      }
    }
  }
}